

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

ExternImpl * __thiscall
slang::BumpAllocator::
emplace<slang::ast::MethodPrototypeSymbol::ExternImpl,slang::ast::SubroutineSymbol_const&>
          (BumpAllocator *this,SubroutineSymbol *args)

{
  ExternImpl *pEVar1;
  SubroutineSymbol *in_RDI;
  ExternImpl *unaff_retaddr;
  
  pEVar1 = (ExternImpl *)allocate((BumpAllocator *)args,(size_t)unaff_retaddr,(size_t)in_RDI);
  slang::ast::MethodPrototypeSymbol::ExternImpl::ExternImpl(unaff_retaddr,in_RDI);
  return pEVar1;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }